

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::ParseCrlDistributionPointsTest_OneUriNoIssuer_Test::TestBody
          (ParseCrlDistributionPointsTest_OneUriNoIssuer_Test *this)

{
  _Head_base<0UL,_bssl::GeneralNames_*,_false> _Var1;
  basic_string_view<char,_std::char_traits<char>_> *lhs;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  pointer pPVar3;
  bool bVar4;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar5;
  char *in_R9;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> dps;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  AssertHelper local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> local_38;
  
  local_38.
  super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = ParseCrlDistributionPointsTest::GetCrlDps
                    (&this->super_ParseCrlDistributionPointsTest,"crldp_1uri_noissuer.pem",&local_38
                    );
  local_70._M_head_impl._0_1_ = (internal)bVar4;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar4) {
    local_78.data_._0_4_ = 1;
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((long)local_38.
                 super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_38.
                 super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_58,"1u","dps.size()",(uint *)&local_78,(unsigned_long *)&local_70);
    if (local_58[0] != (internal)0x0) {
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      pPVar3 = local_38.
               super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var2._M_head_impl = local_70._M_head_impl;
      _Var1._M_head_impl =
           ((local_38.
             super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
             ._M_impl.super__Vector_impl_data._M_start)->distribution_point_fullname)._M_t.
           super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>._M_t.
           super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>.
           super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl;
      local_70._M_head_impl._0_1_ = (internal)(_Var1._M_head_impl != (GeneralNames *)0x0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (_Var1._M_head_impl == (GeneralNames *)0x0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_70,
                   (AssertionResult *)"dp1.distribution_point_fullname","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
                   ,0x2d6,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
        goto LAB_00272537;
      }
      local_70._M_head_impl._4_4_ = SUB84(_Var2._M_head_impl,4);
      local_70._M_head_impl._0_4_ = 0x40;
      testing::internal::CmpHelperEQ<bssl::GeneralNameTypes,int>
                ((internal *)local_58,"GENERAL_NAME_UNIFORM_RESOURCE_IDENTIFIER",
                 "fullname.present_name_types",(GeneralNameTypes *)&local_70,
                 &(_Var1._M_head_impl)->present_name_types);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
                   ,0x2d9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_70._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      local_78.data_._0_4_ = 1;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)*(pointer *)((long)&(_Var1._M_head_impl)->uniform_resource_identifiers + 8) -
            *(long *)&((_Var1._M_head_impl)->uniform_resource_identifiers).
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           >> 4);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_58,"1u","fullname.uniform_resource_identifiers.size()",
                 (uint *)&local_78,(unsigned_long *)&local_70);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_50->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
                   ,0x2da,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
        goto LAB_002727b3;
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      lhs = *(basic_string_view<char,_std::char_traits<char>_> **)
             &((_Var1._M_head_impl)->uniform_resource_identifiers).
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ;
      local_58 = (undefined1  [8])&local_48;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"http://www.example.com/foo.crl","");
      testing::internal::
      CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                ((internal *)&local_70,"fullname.uniform_resource_identifiers.front()",
                 "std::string(\"http://www.example.com/foo.crl\")",lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      if (local_58 != (undefined1  [8])&local_48) {
        operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
      }
      if (local_70._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_58);
        if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_68->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
                   ,0x2dc,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_58 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_58 + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      bVar4 = (pPVar3->distribution_point_name_relative_to_crl_issuer).
              super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
              super__Optional_payload_base<bssl::der::Input>._M_engaged;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT71(local_70._M_head_impl._1_7_,bVar4) ^ 1);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar4 != false) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_70,
                   (AssertionResult *)"dp1.distribution_point_name_relative_to_crl_issuer","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
                   ,0x2de,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_58 != (undefined1  [8])&local_48) {
          operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
      }
      bVar4 = (pPVar3->reasons).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
              super__Optional_payload_base<bssl::der::Input>._M_engaged;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT71(local_70._M_head_impl._1_7_,bVar4) ^ 1);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar4 == true) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_58,(internal *)&local_70,(AssertionResult *)"dp1.reasons","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
                   ,0x2df,(char *)local_58);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_58 != (undefined1  [8])&local_48) {
          operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
      }
      bVar4 = (pPVar3->crl_issuer).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
              super__Optional_payload_base<bssl::der::Input>._M_engaged;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT71(local_70._M_head_impl._1_7_,bVar4) ^ 1);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar4 != true) goto LAB_002727df;
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_58,(internal *)&local_70,(AssertionResult *)"dp1.crl_issuer","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
                 ,0x2e0,(char *)local_58);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_58 != (undefined1  [8])&local_48) goto LAB_0027254f;
      goto LAB_0027255c;
    }
    testing::Message::Message((Message *)&local_70);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
               ,0x2d3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
LAB_002727b3:
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002727df;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_50;
  }
  else {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)&local_70,
               (AssertionResult *)"GetCrlDps(\"crldp_1uri_noissuer.pem\", &dps)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_certificate_unittest.cc"
               ,0x2d1,(char *)local_58);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
LAB_00272537:
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58 != (undefined1  [8])&local_48) {
LAB_0027254f:
      operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
    }
LAB_0027255c:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_68;
    if ((long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,local_78.data_._0_4_) + 8))();
    }
    local_50 = local_68;
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002727df;
  }
  ::std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_50);
LAB_002727df:
  ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>::
  ~vector(&local_38);
  return;
}

Assistant:

TEST(ParseCertificateTest, Version3) {
  RunCertificateTest("cert_version3.pem");
}